

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_bit_color_map.hpp
# Opt level: O2

void __thiscall
boost::
two_bit_color_map<boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>_>
::two_bit_color_map(two_bit_color_map<boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>_>
                    *this,size_t n,
                   vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>
                   *index)

{
  uchar *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  this->n = n;
  uVar3 = n + 3 >> 2;
  puVar1 = (uchar *)operator_new__(uVar3);
  shared_array<unsigned_char>::shared_array<unsigned_char>(&this->data,puVar1);
  puVar1 = (this->data).px;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    puVar1[uVar2] = '\0';
  }
  return;
}

Assistant:

explicit two_bit_color_map(std::size_t n, const IndexMap& index = IndexMap())
    : n(n), index(index), data(new unsigned char[(n + elements_per_char - 1) / elements_per_char])
  {
    // Fill to white
    std::fill(data.get(), data.get() + (n + elements_per_char - 1) / elements_per_char, 0);
  }